

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O2

void __thiscall
World_3df::mutate(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  shared_ptr<Population> *this_00;
  long lVar1;
  int iVar2;
  type pFVar3;
  type pPVar4;
  creat_t *pcVar5;
  type pCVar6;
  undefined4 extraout_var;
  longlong val;
  size_t sVar7;
  Msg local_2b8;
  Msg local_288;
  Msg local_258;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  Msg local_1a8;
  Msg local_178;
  Msg local_148;
  Msg local_118;
  double local_e8;
  double local_e0;
  longlong local_d8;
  shared_ptr<Population> *local_d0;
  Msg local_c8;
  Msg local_98;
  shared_ptr<util::logging::File_logger> local_68;
  ulong local_58;
  longlong local_50;
  long local_48;
  World_3df *local_40;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  local_178._vptr_Msg = (_func_int **)(this->super_World).LOGFILE.px;
  local_178.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_40 = this;
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_178);
  util::logging::Msg::Msg(&local_148,"Mutowanie z p_m = ",L_NORM);
  util::logging::Msg::operator+(&local_98,&local_148,0.005);
  std::__cxx11::string::string((string *)&local_118,"...",(allocator *)&local_1a8);
  util::logging::Msg::operator+(&local_c8,&local_98,(string *)&local_118);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_c8);
  util::logging::Msg::~Msg(&local_c8);
  std::__cxx11::string::~string((string *)&local_118);
  util::logging::Msg::~Msg(&local_98);
  util::logging::Msg::~Msg(&local_148);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.msg_txt);
  pPVar4 = boost::shared_ptr<Population>::operator->(dst);
  sVar7 = pPVar4->ELITE_SIZE;
  local_48 = sVar7 << 4;
  val = 0;
  local_d0 = dst;
  while( true ) {
    this_00 = local_d0;
    pPVar4 = boost::shared_ptr<Population>::operator->(local_d0);
    pcVar5 = Population::get_creatures(pPVar4);
    if ((ulong)((long)(pcVar5->
                      super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pcVar5->
                      super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar7) break;
    local_d8 = val;
    pPVar4 = boost::shared_ptr<Population>::operator->(this_00);
    pcVar5 = Population::get_creatures(pPVar4);
    lVar1 = local_48;
    pCVar6 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&((pcVar5->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->px + local_48));
    local_e8 = pCVar6->fitness;
    pPVar4 = boost::shared_ptr<Population>::operator->(this_00);
    local_58 = sVar7;
    iVar2 = (*pPVar4->_vptr_Population[4])(0x3f747ae147ae147b,pPVar4,sVar7);
    local_50 = CONCAT44(extraout_var,iVar2);
    pPVar4 = boost::shared_ptr<Population>::operator->(this_00);
    pcVar5 = Population::get_creatures(pPVar4);
    pCVar6 = boost::shared_ptr<Creature>::operator->
                       ((shared_ptr<Creature> *)
                        ((long)&((pcVar5->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->px + lVar1));
    local_e0 = pCVar6->fitness;
    local_68.px = (local_40->super_World).LOGFILE.px;
    local_68.pn.pi_ = (local_40->super_World).LOGFILE.pn.pi_;
    if (local_68.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_68.pn.pi_)->use_count_ = (local_68.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*(&local_68);
    util::logging::Msg::Msg(&local_288,anon_var_dwarf_33fbb,L_NORM);
    util::logging::Msg::operator+(&local_258,&local_288,local_58);
    std::__cxx11::string::string((string *)&local_228,anon_var_dwarf_33fd1,&local_34);
    util::logging::Msg::operator+(&local_2b8,&local_258,&local_228);
    util::logging::Msg::operator+(&local_1a8,&local_2b8,local_50);
    std::__cxx11::string::string((string *)&local_208," mutacji {",&local_33);
    util::logging::Msg::operator+(&local_178,&local_1a8,&local_208);
    util::logging::Msg::operator+(&local_118,&local_178,local_e8);
    std::__cxx11::string::string((string *)&local_1e8," -> ",&local_32);
    util::logging::Msg::operator+(&local_148,&local_118,&local_1e8);
    util::logging::Msg::operator+(&local_98,&local_148,local_e0);
    std::__cxx11::string::string((string *)&local_1c8,"}",&local_31);
    util::logging::Msg::operator+(&local_c8,&local_98,&local_1c8);
    (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_c8);
    util::logging::Msg::~Msg(&local_c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    util::logging::Msg::~Msg(&local_98);
    util::logging::Msg::~Msg(&local_148);
    std::__cxx11::string::~string((string *)&local_1e8);
    util::logging::Msg::~Msg(&local_118);
    util::logging::Msg::~Msg(&local_178);
    std::__cxx11::string::~string((string *)&local_208);
    util::logging::Msg::~Msg(&local_1a8);
    util::logging::Msg::~Msg(&local_2b8);
    std::__cxx11::string::~string((string *)&local_228);
    util::logging::Msg::~Msg(&local_258);
    util::logging::Msg::~Msg(&local_288);
    boost::detail::shared_count::~shared_count(&local_68.pn);
    val = local_d8 + local_50;
    sVar7 = local_58 + 1;
    local_48 = local_48 + 0x10;
  }
  local_178._vptr_Msg = (_func_int **)(local_40->super_World).LOGFILE.px;
  local_178.msg_txt._M_dataplus._M_p = (pointer)(local_40->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_178);
  util::logging::Msg::Msg(&local_148,"... W sumie ",L_NORM);
  util::logging::Msg::operator+(&local_98,&local_148,val);
  std::__cxx11::string::string((string *)&local_118," mutacji",(allocator *)&local_1a8);
  util::logging::Msg::operator+(&local_c8,&local_98,(string *)&local_118);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_c8);
  util::logging::Msg::~Msg(&local_c8);
  std::__cxx11::string::~string((string *)&local_118);
  util::logging::Msg::~Msg(&local_98);
  util::logging::Msg::~Msg(&local_148);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.msg_txt);
  local_98._vptr_Msg = (_func_int **)(local_40->super_World).LOGFILE.px;
  local_98.msg_txt._M_dataplus._M_p = (pointer)(local_40->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_98.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_98.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_98.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_98);
  util::logging::Msg::Msg(&local_c8,anon_var_dwarf_33f1d,L_NORM);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_c8);
  util::logging::Msg::~Msg(&local_c8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_98.msg_txt);
  return;
}

Assistant:

void World_3df::mutate( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.005;

	(*get_log()) << util::logging::Msg("Mutowanie z p_m = ") + prob + "...";

	size_t mcc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		double m1 = dst->get_creatures()[i]->get_fitness();
		size_t mc = dst->mutate(i, prob);
		double m2 = dst->get_creatures()[i]->get_fitness();

		(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i) + "] zaliczył "
				+ static_cast<long long> (mc) + " mutacji {" + m1 + " -> " + m2 + "}";
		mcc += mc;

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " mutacji";

	(*get_log()) << "Już";
}